

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  byte *pbVar1;
  stbi_uc *psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  stbi_uc *psVar11;
  stbi_uc sVar12;
  long lVar13;
  uint uVar14;
  char *zout;
  uint uVar15;
  size_t sVar16;
  uint uVar17;
  long lVar18;
  undefined1 local_a2c [8];
  stbi__zhuffman z_codelength;
  stbi_uc lencodes [455];
  byte local_78 [24];
  ulong local_60;
  stbi__zhuffman *local_58;
  stbi__zhuffman *local_50;
  long local_48;
  uint local_3c;
  int local_38;
  uint local_34;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0010dca0:
    a->num_bits = 0;
    a->code_buffer = 0;
    local_58 = &a->z_length;
    local_50 = &a->z_distance;
    do {
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar4 = a->num_bits;
      uVar15 = a->code_buffer;
      a->code_buffer = uVar15 >> 1;
      a->num_bits = iVar4 + -1;
      if (iVar4 < 3) {
        stbi__fill_bits(a);
      }
      iVar4 = a->num_bits;
      uVar8 = a->code_buffer;
      a->code_buffer = uVar8 >> 2;
      uVar17 = iVar4 - 2;
      a->num_bits = uVar17;
      local_38 = 0;
      switch(uVar8 & 3) {
      case 0:
        uVar17 = uVar17 & 7;
        if (uVar17 != 0) {
          if (iVar4 < 2) {
            stbi__fill_bits(a);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar17;
          a->num_bits = a->num_bits - uVar17;
        }
        iVar4 = a->num_bits;
        if (iVar4 < 1) {
          uVar6 = 0;
        }
        else {
          uVar8 = a->code_buffer;
          uVar6 = 0;
          iVar5 = iVar4;
          do {
            local_a2c[uVar6] = (char)uVar8;
            uVar6 = uVar6 + 1;
            uVar8 = uVar8 >> 8;
            iVar4 = iVar5 + -8;
            bVar3 = 8 < iVar5;
            iVar5 = iVar4;
          } while (bVar3);
          a->code_buffer = uVar8;
          a->num_bits = iVar4;
        }
        if (iVar4 != 0) {
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                        ,0xe8d,"int stbi__parse_uncomperssed_block(stbi__zbuf *)");
        }
        if ((uint)uVar6 < 4) {
          psVar11 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          uVar6 = uVar6 & 0xffffffff;
          do {
            if (psVar11 < psVar2) {
              a->zbuffer = psVar11 + 1;
              sVar12 = *psVar11;
              psVar11 = psVar11 + 1;
            }
            else {
              sVar12 = '\0';
            }
            local_a2c[uVar6] = sVar12;
            uVar6 = uVar6 + 1;
          } while (uVar6 != 4);
        }
        if ((local_a2c._2_2_ ^ local_a2c._0_2_) == 0xffff) {
          uVar6 = (ulong)(ushort)local_a2c._0_2_;
          if (a->zbuffer_end < a->zbuffer + uVar6) {
            stbi__g_failure_reason = "read past buffer";
          }
          else if ((a->zout + uVar6 <= a->zout_end) ||
                  (iVar4 = stbi__zexpand(a,a->zout,(uint)(ushort)local_a2c._0_2_), iVar4 != 0)) {
            memcpy(a->zout,a->zbuffer,uVar6);
            a->zbuffer = a->zbuffer + uVar6;
            a->zout = a->zout + uVar6;
            goto LAB_0010e5c3;
          }
        }
        else {
          stbi__g_failure_reason = "zlib corrupt";
        }
        goto LAB_0010e5ff;
      case 1:
        if (stbi__zdefault_distance[0x1f] == '\0') {
          memset(stbi__zdefault_length,8,0x90);
          builtin_memcpy(stbi__zdefault_length + 0x90,
                         "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                         ,0x90);
          builtin_memcpy(stbi__zdefault_distance,
                         "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                         ,0x20);
        }
        iVar4 = stbi__zbuild_huffman(local_58,stbi__zdefault_length,0x120);
        if (iVar4 == 0) {
          return local_38;
        }
        local_3c = uVar15;
        iVar4 = stbi__zbuild_huffman(local_50,stbi__zdefault_distance,0x20);
        if (iVar4 == 0) {
          return local_38;
        }
        break;
      case 2:
        if (iVar4 < 7) {
          stbi__fill_bits(a);
        }
        iVar4 = a->num_bits;
        uVar8 = a->code_buffer;
        a->code_buffer = uVar8 >> 5;
        a->num_bits = iVar4 + -5;
        if (iVar4 < 10) {
          stbi__fill_bits(a);
        }
        iVar4 = a->num_bits;
        uVar17 = a->code_buffer;
        a->code_buffer = uVar17 >> 5;
        a->num_bits = iVar4 + -5;
        local_3c = uVar15;
        if (iVar4 < 9) {
          stbi__fill_bits(a);
        }
        local_48 = (ulong)(uVar8 & 0x1f) + 0x101;
        local_60 = (ulong)((uVar17 & 0x1f) + 1);
        uVar15 = a->code_buffer;
        a->code_buffer = uVar15 >> 4;
        a->num_bits = a->num_bits + -4;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[6] = 0;
        local_78[7] = 0;
        local_78[8] = 0;
        local_78[9] = 0;
        local_78[10] = 0;
        local_78[0xb] = 0;
        local_78[0xc] = 0;
        local_78[0xd] = 0;
        local_78[0xe] = 0;
        local_78[0xf] = 0;
        local_78[0x10] = 0;
        local_78[0x11] = 0;
        local_78[0x12] = 0;
        lVar18 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar8 = a->code_buffer;
          a->code_buffer = uVar8 >> 3;
          a->num_bits = a->num_bits + -3;
          local_78[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar18]] =
               (byte)uVar8 & 7;
          lVar18 = lVar18 + 1;
        } while ((ulong)(uVar15 & 0xf) + 4 != lVar18);
        iVar4 = stbi__zbuild_huffman((stbi__zhuffman *)local_a2c,local_78,0x13);
        if (iVar4 == 0) {
          return local_38;
        }
        uVar15 = (int)local_60 + (int)local_48;
        uVar17 = 0;
        local_34 = uVar15;
        while ((int)uVar17 < (int)uVar15) {
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar8 = a->code_buffer;
          uVar7 = *(ushort *)(local_a2c + (ulong)(uVar8 & 0x1ff) * 2);
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
            uVar9 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333) * 4;
            uVar9 = (uVar9 >> 1 & 0x5555) + (uVar9 & 0x5555) * 2;
            lVar18 = 0;
            do {
              lVar10 = lVar18;
              lVar18 = lVar10 + 1;
            } while (z_codelength.maxcode[lVar10 + 8] <= (int)uVar9);
            uVar14 = 0xffffffff;
            if (lVar18 != 7) {
              lVar13 = (ulong)z_codelength.firstsymbol[lVar10 + 6] +
                       ((ulong)(uVar9 >> (7U - (char)lVar18 & 0x1f)) -
                       (ulong)z_codelength.firstcode[lVar10 + 6]);
              if ((ulong)*(byte *)((long)&z_codelength + lVar13 + 0x47c) - 9 != lVar18)
              goto LAB_0010e62b;
              a->code_buffer = uVar8 >> ((char)lVar10 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar18) + -9;
              uVar14 = (uint)*(ushort *)((long)&z_codelength + lVar13 * 2 + 0x59c);
            }
          }
          else {
            a->code_buffer = uVar8 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
            uVar14 = uVar7 & 0x1ff;
          }
          if (uVar14 < 0x13) {
            if ((int)uVar14 < 0x10) {
              lVar18 = (long)(int)uVar17;
              uVar17 = uVar17 + 1;
              lencodes[lVar18 + -8] = (stbi_uc)uVar14;
            }
            else {
              iVar4 = a->num_bits;
              if (uVar14 == 0x11) {
                if (iVar4 < 3) {
                  stbi__fill_bits(a);
                }
                uVar15 = a->code_buffer;
                a->code_buffer = uVar15 >> 3;
                a->num_bits = a->num_bits + -3;
                sVar16 = (ulong)(uVar15 & 7) + 3;
                memset(lencodes + (long)(int)uVar17 + -8,0,sVar16);
                iVar4 = (int)sVar16;
              }
              else {
                if (uVar14 == 0x10) {
                  if (iVar4 < 2) {
                    stbi__fill_bits(a);
                  }
                  uVar15 = a->code_buffer;
                  a->code_buffer = uVar15 >> 2;
                  a->num_bits = a->num_bits + -2;
                  sVar16 = (ulong)(uVar15 & 3) + 3;
                  uVar15 = (uint)lencodes[(long)(int)uVar17 + -9];
                }
                else {
                  if (iVar4 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar15 = a->code_buffer;
                  a->code_buffer = uVar15 >> 7;
                  a->num_bits = a->num_bits + -7;
                  sVar16 = (ulong)(uVar15 & 0x7f) + 0xb;
                  uVar15 = 0;
                }
                memset(lencodes + (long)(int)uVar17 + -8,uVar15,sVar16);
                iVar4 = (int)sVar16;
              }
              uVar17 = uVar17 + iVar4;
              uVar15 = local_34;
            }
          }
          else {
            stbi__g_failure_reason = "bad codelengths";
          }
          if (0x12 < uVar14) {
            return local_38;
          }
        }
        if (uVar17 != uVar15) {
          stbi__g_failure_reason = "bad codelengths";
          return local_38;
        }
        iVar4 = stbi__zbuild_huffman(local_58,(stbi_uc *)(z_codelength.value + 0x11c),(int)local_48)
        ;
        if (iVar4 == 0) {
          return local_38;
        }
        iVar4 = stbi__zbuild_huffman(local_50,lencodes + local_48 + -8,(int)local_60);
        if (iVar4 == 0) goto LAB_0010e5ff;
        break;
      case 3:
        goto switchD_0010dd1f_caseD_3;
      }
      zout = a->zout;
      do {
        if (a->num_bits < 0x10) {
          stbi__fill_bits(a);
        }
        uVar15 = a->code_buffer;
        uVar7 = (a->z_length).fast[uVar15 & 0x1ff];
        if (uVar7 == 0) {
          uVar7 = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
          uVar8 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
          uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333) * 4;
          uVar8 = (uVar8 >> 1 & 0x5555) + (uVar8 & 0x5555) * 2;
          lVar18 = 0;
          do {
            lVar10 = lVar18;
            lVar18 = lVar10 + 1;
          } while ((a->z_length).maxcode[lVar10 + 10] <= (int)uVar8);
          uVar9 = 0xffffffff;
          if (lVar18 != 7) {
            lVar13 = (ulong)(a->z_length).firstsymbol[lVar10 + 10] +
                     ((ulong)(uVar8 >> (7U - (char)lVar18 & 0x1f)) -
                     (ulong)(a->z_length).firstcode[lVar10 + 10]);
            if ((ulong)*(byte *)((long)a + lVar13 + 0x4b8) - 9 != lVar18) {
LAB_0010e62b:
              __assert_fail("z->size[b] == s",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                            ,0xdf4,
                            "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
            }
            a->code_buffer = uVar15 >> ((char)lVar10 + 10U & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar18) + -9;
            uVar9 = (uint)*(ushort *)((long)a + lVar13 * 2 + 0x5d8);
          }
        }
        else {
          a->code_buffer = uVar15 >> ((byte)(uVar7 >> 9) & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
          uVar9 = uVar7 & 0x1ff;
        }
        if ((int)uVar9 < 0x100) {
          if ((int)uVar9 < 0) {
LAB_0010e488:
            stbi__g_failure_reason = "bad huffman code";
LAB_0010e496:
            bVar3 = false;
            uVar17 = 0;
          }
          else {
            if (a->zout_end <= zout) {
              iVar4 = stbi__zexpand(a,zout,1);
              if (iVar4 == 0) goto LAB_0010e496;
              zout = a->zout;
            }
            *zout = (char)uVar9;
            zout = zout + 1;
            bVar3 = true;
          }
        }
        else if (uVar9 == 0x100) {
          a->zout = zout;
          bVar3 = false;
          uVar17 = 1;
        }
        else {
          uVar6 = (ulong)(uVar9 - 0x101);
          uVar15 = stbi__zlength_base[uVar6];
          local_34 = uVar17;
          if (0xffffffffffffffeb < uVar6 - 0x1c) {
            iVar4 = stbi__zlength_extra[uVar6];
            if (a->num_bits < iVar4) {
              stbi__fill_bits(a);
            }
            uVar8 = a->code_buffer;
            a->code_buffer = uVar8 >> ((byte)iVar4 & 0x1f);
            a->num_bits = a->num_bits - iVar4;
            uVar15 = uVar15 + (~(-1 << ((byte)iVar4 & 0x1f)) & uVar8);
          }
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar8 = a->code_buffer;
          uVar7 = (a->z_distance).fast[uVar8 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
            uVar17 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar17 = (uVar17 >> 2 & 0x3333) + (uVar17 & 0x3333) * 4;
            uVar17 = (uVar17 >> 1 & 0x5555) + (uVar17 & 0x5555) * 2;
            lVar18 = 0;
            do {
              lVar10 = lVar18;
              lVar18 = lVar10 + 1;
            } while ((a->z_distance).maxcode[lVar10 + 10] <= (int)uVar17);
            uVar9 = 0xffffffff;
            if (lVar18 != 7) {
              lVar13 = (ulong)(a->z_distance).firstsymbol[lVar10 + 10] +
                       ((ulong)(uVar17 >> (7U - (char)lVar18 & 0x1f)) -
                       (ulong)(a->z_distance).firstcode[lVar10 + 10]);
              if ((ulong)*(byte *)((long)a + lVar13 + 0xc9c) - 9 != lVar18) goto LAB_0010e62b;
              a->code_buffer = uVar8 >> ((char)lVar10 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar18) + -9;
              uVar9 = (uint)*(ushort *)((long)a + lVar13 * 2 + 0xdbc);
            }
          }
          else {
            a->code_buffer = uVar8 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
            uVar9 = uVar7 & 0x1ff;
          }
          if ((int)uVar9 < 0) goto LAB_0010e488;
          uVar6 = (ulong)uVar9;
          iVar4 = stbi__zdist_base[uVar6];
          if (0xffffffffffffffe5 < uVar6 - 0x1e) {
            iVar5 = stbi__zdist_extra[uVar6];
            if (a->num_bits < iVar5) {
              stbi__fill_bits(a);
            }
            uVar8 = a->code_buffer;
            a->code_buffer = uVar8 >> ((byte)iVar5 & 0x1f);
            a->num_bits = a->num_bits - iVar5;
            iVar4 = iVar4 + (~(-1 << ((byte)iVar5 & 0x1f)) & uVar8);
          }
          if ((long)zout - (long)a->zout_start < (long)iVar4) {
            stbi__g_failure_reason = "bad dist";
            bVar3 = false;
            uVar17 = 0;
          }
          else {
            if (a->zout_end < zout + (int)uVar15) {
              iVar5 = stbi__zexpand(a,zout,uVar15);
              if (iVar5 == 0) goto LAB_0010e496;
              zout = a->zout;
            }
            lVar18 = -(long)iVar4;
            if (iVar4 == 1) {
              if (uVar15 != 0) {
                memset(zout,(uint)(byte)zout[lVar18],(ulong)uVar15);
                zout = zout + (ulong)(uVar15 - 1) + 1;
              }
            }
            else {
              for (; uVar15 != 0; uVar15 = uVar15 - 1) {
                *zout = zout[lVar18];
                zout = zout + 1;
              }
            }
            bVar3 = true;
            uVar17 = local_34;
          }
        }
      } while (bVar3);
      uVar15 = local_3c;
      if (uVar17 == 0) {
        return local_38;
      }
LAB_0010e5c3:
    } while ((uVar15 & 1) == 0);
    local_38 = 1;
  }
  else {
    pbVar1 = a->zbuffer;
    uVar8 = 0;
    uVar15 = 0;
    if (pbVar1 < a->zbuffer_end) {
      a->zbuffer = pbVar1 + 1;
      uVar15 = (uint)*pbVar1;
    }
    pbVar1 = a->zbuffer;
    if (pbVar1 < a->zbuffer_end) {
      a->zbuffer = pbVar1 + 1;
      uVar8 = (uint)*pbVar1;
    }
    if ((uVar15 << 8 | uVar8) * -0x42108421 < 0x8421085) {
      if ((uVar8 & 0x20) == 0) {
        if ((uVar15 & 0xf) == 8) goto LAB_0010dca0;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
LAB_0010e5ff:
    local_38 = 0;
  }
switchD_0010dd1f_caseD_3:
  return local_38;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}